

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v9::detail::digit_grouping<char>::apply<fmt::v9::appender,char>
          (digit_grouping<char> *this,appender out,basic_string_view<char> digits)

{
  type tVar1;
  size_t sVar2;
  int *piVar3;
  buffer<char> *in_RSI;
  digit_grouping<char> *in_RDI;
  next_state nVar4;
  int sep_index;
  int i_1;
  int i;
  next_state state;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  int num_digits;
  allocator<int> *in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff750;
  int in_stack_fffffffffffff754;
  next_state *state_00;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> in_stack_fffffffffffff778;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_878;
  char local_86d;
  int local_86c;
  int local_868;
  int local_864;
  char *local_860;
  int local_858;
  char *local_850;
  int local_848;
  undefined4 local_840;
  undefined1 local_829 [2045];
  int local_2c;
  basic_string_view<char> local_20;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_10;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_8;
  
  local_10.container = in_RSI;
  sVar2 = basic_string_view<char>::size(&local_20);
  local_2c = (int)sVar2;
  state_00 = (next_state *)local_829;
  std::allocator<int>::allocator((allocator<int> *)0x1bd1da);
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),in_stack_fffffffffffff748
            );
  std::allocator<int>::~allocator((allocator<int> *)0x1bd1fb);
  local_840 = 0;
  buffer<int>::push_back
            ((buffer<int> *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             (int *)in_stack_fffffffffffff748);
  nVar4 = initial_state((digit_grouping<char> *)0x1bd221);
  local_860 = (char *)nVar4.group._M_current;
  local_858 = nVar4.pos;
  local_850 = local_860;
  local_848 = local_858;
  while ((local_864 = next((digit_grouping<char> *)in_stack_fffffffffffff778.container,state_00),
         local_864 != 0 && (local_864 < local_2c))) {
    buffer<int>::push_back
              ((buffer<int> *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               (int *)in_stack_fffffffffffff748);
  }
  local_868 = 0;
  sVar2 = buffer<int>::size((buffer<int> *)(local_829 + 1));
  local_86c = (int)sVar2 + -1;
  for (; local_868 < local_2c; local_868 = local_868 + 1) {
    in_stack_fffffffffffff754 = local_2c - local_868;
    piVar3 = buffer<int>::operator[]<int>((buffer<int> *)(local_829 + 1),local_86c);
    if (in_stack_fffffffffffff754 == *piVar3) {
      local_86d = separator(in_RDI);
      in_stack_fffffffffffff750 = CONCAT13(local_86d,(int3)in_stack_fffffffffffff750);
      local_878.container = (buffer<char> *)appender::operator++((appender *)&local_10,0);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_878);
      std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
                ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
                 CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
                 (value_type *)in_stack_fffffffffffff748);
      local_86c = local_86c + -1;
    }
    tVar1 = to_unsigned<int>(0);
    basic_string_view<char>::operator[](&local_20,(ulong)tVar1);
    appender::operator++((appender *)&local_10,0);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)&stack0xfffffffffffff778);
    std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v9::detail::buffer<char>_> *)
               CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
               (value_type *)in_stack_fffffffffffff748);
  }
  local_8.container = local_10.container;
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::~basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_8.container;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }